

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

LaneArray<4> * __thiscall
wasm::Literal::getLanesF32x4(LaneArray<4> *__return_storage_ptr__,Literal *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  Literal local_40;
  ulong local_28;
  size_t i;
  Literal *local_18;
  Literal *this_local;
  LaneArray<4> *lanes;
  
  i._7_1_ = 0;
  local_18 = this;
  this_local = __return_storage_ptr__->_M_elems;
  getLanesI32x4(__return_storage_ptr__,this);
  for (local_28 = 0; uVar1 = local_28,
      sVar2 = std::array<wasm::Literal,_4UL>::size(__return_storage_ptr__), uVar1 < sVar2;
      local_28 = local_28 + 1) {
    pvVar3 = std::array<wasm::Literal,_4UL>::operator[](__return_storage_ptr__,local_28);
    castToF32(&local_40,pvVar3);
    pvVar3 = std::array<wasm::Literal,_4UL>::operator[](__return_storage_ptr__,local_28);
    operator=(pvVar3,&local_40);
    ~Literal(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

LaneArray<4> Literal::getLanesF32x4() const {
  auto lanes = getLanesI32x4();
  for (size_t i = 0; i < lanes.size(); ++i) {
    lanes[i] = lanes[i].castToF32();
  }
  return lanes;
}